

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_compact(REF_CELL ref_cell,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  int local_44;
  REF_INT ref_malloc_init_i;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT ncell;
  REF_INT cell;
  REF_INT **n2o_ptr_local;
  REF_INT **o2n_ptr_local;
  REF_CELL ref_cell_local;
  
  if (ref_cell->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x357,
           "ref_cell_compact","malloc *o2n_ptr of REF_INT negative");
    ref_cell_local._4_4_ = 1;
  }
  else {
    pRVar1 = (REF_INT *)malloc((long)ref_cell->max << 2);
    *o2n_ptr = pRVar1;
    if (*o2n_ptr == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x357,
             "ref_cell_compact","malloc *o2n_ptr of REF_INT NULL");
      ref_cell_local._4_4_ = 2;
    }
    else {
      for (local_44 = 0; local_44 < ref_cell->max; local_44 = local_44 + 1) {
        (*o2n_ptr)[local_44] = -1;
      }
      pRVar1 = *o2n_ptr;
      if (ref_cell->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x359,"ref_cell_compact","malloc *n2o_ptr of REF_INT negative");
        ref_cell_local._4_4_ = 1;
      }
      else {
        pRVar2 = (REF_INT *)malloc((long)ref_cell->n << 2);
        *n2o_ptr = pRVar2;
        if (*n2o_ptr == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x359,"ref_cell_compact","malloc *n2o_ptr of REF_INT NULL");
          ref_cell_local._4_4_ = 2;
        }
        else {
          pRVar2 = *n2o_ptr;
          o2n._0_4_ = 0;
          for (o2n._4_4_ = 0; o2n._4_4_ < ref_cell->max; o2n._4_4_ = o2n._4_4_ + 1) {
            if (((-1 < o2n._4_4_) && (o2n._4_4_ < ref_cell->max)) &&
               (ref_cell->c2n[ref_cell->size_per * o2n._4_4_] != -1)) {
              pRVar1[o2n._4_4_] = (int)o2n;
              o2n._0_4_ = (int)o2n + 1;
            }
          }
          if ((int)o2n == ref_cell->n) {
            for (o2n._4_4_ = 0; o2n._4_4_ < ref_cell->max; o2n._4_4_ = o2n._4_4_ + 1) {
              if (((-1 < o2n._4_4_) && (o2n._4_4_ < ref_cell->max)) &&
                 (ref_cell->c2n[ref_cell->size_per * o2n._4_4_] != -1)) {
                pRVar2[pRVar1[o2n._4_4_]] = o2n._4_4_;
              }
            }
            ref_cell_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x363,"ref_cell_compact","ncell miscount");
            ref_cell_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_compact(REF_CELL ref_cell, REF_INT **o2n_ptr,
                                    REF_INT **n2o_ptr) {
  REF_INT cell;
  REF_INT ncell;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_cell_n(ref_cell), REF_INT);
  n2o = *n2o_ptr;

  ncell = 0;

  each_ref_cell_valid_cell(ref_cell, cell) {
    o2n[cell] = ncell;
    ncell++;
  }

  RES(ncell, ref_cell_n(ref_cell), "ncell miscount");

  each_ref_cell_valid_cell(ref_cell, cell) n2o[o2n[cell]] = cell;

  return REF_SUCCESS;
}